

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void api_fixed_suite::fixed_pop_back(void)

{
  basic_iterator<int> first_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end;
  pointer ptVar1;
  uint uVar2;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_4UL> span;
  int array [4];
  allocator_type local_81;
  vector<int,_std::allocator<int>_> local_80;
  int local_68 [2];
  circular_view<int,_4UL> local_60;
  circular_view<int,_4UL> *local_48;
  ulong uStack_40;
  type local_38 [4];
  
  local_60.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_60.member.size = 0;
  local_60.member.next = 4;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  input._M_len = 3;
  input._M_array = (iterator)&local_80;
  vista::circular_view<int,_4UL>::assign(&local_60,input);
  ptVar1 = local_60.member.data;
  if (local_60.member.size != 0) {
    uVar2 = (int)local_60.member.next - 1;
    vista::circular_view<int,_4UL>::remove_back(&local_60,1);
    local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,ptVar1[uVar2 & 3]);
    local_68[0] = 0x21;
    boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
              ("span.pop_back()","33",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
               ,0x401,"void api_fixed_suite::fixed_pop_back()",&local_80,local_68);
    local_68[0] = 0xb;
    local_68[1] = 0x16;
    __l._M_len = 2;
    __l._M_array = local_68;
    std::vector<int,_std::allocator<int>_>::vector(&local_80,__l,&local_81);
    first_begin.current._0_4_ = (uint)local_60.member.next - (int)local_60.member.size & 7;
    uVar2 = (uint)local_60.member.next & 7;
    uStack_40 = (ulong)uVar2;
    second_end._M_current._4_4_ =
         local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish._4_4_;
    second_end._M_current._0_4_ =
         local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish._0_4_;
    first_end.current._0_4_ = uVar2;
    first_end.parent = &local_60;
    first_end.current._4_4_ = 0;
    first_begin.parent = &local_60;
    first_begin.current._4_4_ = 0;
    local_48 = &local_60;
    boost::detail::
    test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
               ,0x405,"void api_fixed_suite::fixed_pop_back()",first_begin,first_end,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,second_end);
    if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/include/vista/detail/circular_view.ipp"
                ,0x80,"reference vista::circular_view<int, 4>::back() [T = int, Extent = 4]");
}

Assistant:

void fixed_pop_back()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    span = {11, 22, 33};
    BOOST_TEST_EQ(span.pop_back(), 33);
    {
        std::vector<int> expect = {11, 22};
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}